

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool __thiscall cmLocalGenerator::CheckDefinition(cmLocalGenerator *this,string *define)

{
  long lVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_368;
  ostringstream local_348 [8];
  ostringstream e_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  size_type pos;
  string *define_local;
  cmLocalGenerator *this_local;
  
  lVar1 = std::__cxx11::string::find_first_of((char *)define,0x8387d5);
  if ((lVar1 == -1) ||
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)define), *pcVar2 != '(')) {
    lVar1 = std::__cxx11::string::find_first_of((char)define,0x23);
    if (lVar1 == -1) {
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_348);
      poVar3 = std::operator<<((ostream *)local_348,
                               "WARNING: Preprocessor definitions containing \'#\' may not be ");
      poVar3 = std::operator<<(poVar3,"passed on the compiler command line because many compilers ")
      ;
      poVar3 = std::operator<<(poVar3,"do not support it.\n");
      poVar3 = std::operator<<(poVar3,"CMake is dropping a preprocessor definition: ");
      poVar3 = std::operator<<(poVar3,(string *)define);
      poVar3 = std::operator<<(poVar3,"\n");
      std::operator<<(poVar3,"Consider defining the macro in a (configured) header file.\n");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Message(&local_368,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_368);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream(local_348);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = std::operator<<((ostream *)local_1a0,
                             "WARNING: Function-style preprocessor definitions may not be ");
    poVar3 = std::operator<<(poVar3,"passed on the compiler command line because many compilers ");
    poVar3 = std::operator<<(poVar3,"do not support it.\n");
    poVar3 = std::operator<<(poVar3,"CMake is dropping a preprocessor definition: ");
    poVar3 = std::operator<<(poVar3,(string *)define);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"Consider defining the macro in a (configured) header file.\n");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Message(&local_1d0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return this_local._7_1_;
}

Assistant:

bool cmLocalGenerator::CheckDefinition(std::string const& define) const
{
  // Many compilers do not support -DNAME(arg)=sdf so we disable it.
  std::string::size_type pos = define.find_first_of("(=");
  if (pos != std::string::npos) {
    if (define[pos] == '(') {
      std::ostringstream e;
      /* clang-format off */
      e << "WARNING: Function-style preprocessor definitions may not be "
        << "passed on the compiler command line because many compilers "
        << "do not support it.\n"
        << "CMake is dropping a preprocessor definition: " << define << "\n"
        << "Consider defining the macro in a (configured) header file.\n";
      /* clang-format on */
      cmSystemTools::Message(e.str());
      return false;
    }
  }

  // Many compilers do not support # in the value so we disable it.
  if (define.find_first_of('#') != std::string::npos) {
    std::ostringstream e;
    /* clang-format off */
    e << "WARNING: Preprocessor definitions containing '#' may not be "
      << "passed on the compiler command line because many compilers "
      << "do not support it.\n"
      << "CMake is dropping a preprocessor definition: " << define << "\n"
      << "Consider defining the macro in a (configured) header file.\n";
    /* clang-format on */
    cmSystemTools::Message(e.str());
    return false;
  }

  // Assume it is supported.
  return true;
}